

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::vprint(FILE *f,string_view format_str,format_args args)

{
  undefined1 local_228 [8];
  memory_buffer buffer;
  
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&buffer.super_buffer<char>.capacity_;
  buffer.super_buffer<char>.ptr_ = (char *)0x0;
  local_228 = (undefined1  [8])&PTR_grow_002b9bf8;
  buffer.super_buffer<char>.size_ = 500;
  detail::vformat_to<char>
            ((buffer<char> *)local_228,format_str,
             args.
             super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            );
  detail::fwrite_fully
            (buffer.super_buffer<char>._vptr_buffer,1,(size_t)buffer.super_buffer<char>.ptr_,f);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_228);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = DWORD();
    if (!WriteConsoleW(reinterpret_cast<HANDLE>(_get_osfhandle(fd)),
                       u16.c_str(), static_cast<DWORD>(u16.size()), &written,
                       nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}